

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall fmp4_stream::trun::parse(trun *this,char *ptr)

{
  uint uVar1;
  uint uVar2;
  uint i;
  uint uVar3;
  ulong uStack_60;
  sample_entry ent;
  
  full_box::parse(&this->super_full_box,ptr);
  uVar3 = *(uint *)(ptr + 0xc);
  uVar2 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  *(uint *)&(this->super_full_box).field_0x6c = uVar2;
  uVar3 = *(uint *)&(this->super_full_box).super_box.field_0x64;
  this->data_offset_present_ = SUB41(uVar3 & 1,0);
  this->first_sample_flags_present_ = SUB41((uVar3 & 4) >> 2,0);
  this->sample_duration_present_ = (bool)((byte)(uVar3 >> 8) & 1);
  this->sample_size_present_ = (bool)((byte)(uVar3 >> 9) & 1);
  this->sample_flags_present_ = (bool)((byte)(uVar3 >> 10) & 1);
  this->sample_composition_time_offsets_present_ = (bool)((byte)(uVar3 >> 0xb) & 1);
  if ((uVar3 & 1) == 0) {
    uStack_60 = 0x10;
  }
  else {
    uVar1 = *(uint *)(ptr + 0x10);
    this->data_offset_ =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uStack_60 = 0x14;
  }
  if ((uVar3 & 4) != 0) {
    uVar3 = *(uint *)(ptr + uStack_60);
    this->first_sample_flags_ =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uStack_60 = (ulong)((int)uStack_60 + 4);
  }
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    ent._vptr_sample_entry = (_func_int **)&PTR_print_0011bd20;
    ent.sample_composition_time_offset_v1_ = 0;
    ent.sample_duration_ = 0;
    ent.sample_size_ = 0;
    ent.sample_flags_ = 0;
    ent.sample_composition_time_offset_v0_ = 0;
    if (this->sample_duration_present_ == true) {
      uVar2 = *(uint *)(ptr + uStack_60);
      ent.sample_size_ = 0;
      ent.sample_duration_ =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uStack_60 = (ulong)((int)uStack_60 + 4);
    }
    if (this->sample_size_present_ == true) {
      uVar2 = *(uint *)(ptr + uStack_60);
      ent.sample_size_ =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uStack_60 = (ulong)((int)uStack_60 + 4);
    }
    if (this->sample_flags_present_ == true) {
      uVar2 = *(uint *)(ptr + uStack_60);
      ent.sample_composition_time_offset_v0_ = 0;
      ent.sample_flags_ =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uStack_60 = (ulong)((int)uStack_60 + 4);
    }
    if (this->sample_composition_time_offsets_present_ == true) {
      uVar2 = *(uint *)(ptr + uStack_60);
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if ((this->super_full_box).super_box.field_0x62 == '\0') {
        ent.sample_composition_time_offset_v0_ = uVar2;
        uVar2 = ent.sample_composition_time_offset_v1_;
      }
      ent.sample_composition_time_offset_v1_ = uVar2;
      uStack_60 = (ulong)((int)uStack_60 + 4);
    }
    std::vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>::
    push_back(&this->m_sentry,&ent);
    uVar2 = *(uint *)&(this->super_full_box).field_0x6c;
  }
  return;
}

Assistant:

void trun::parse(const char * ptr)
	{
		full_box::parse(ptr);

		sample_count_ = fmp4_read_uint32(ptr + 12);

		std::bitset<32> bb(flags_);

		data_offset_present_ = bb[0];
		//cout << "data_offset_present " << data_offset_present << endl;
		first_sample_flags_present_ = bb[2];
		//cout << "first_sample_flags_present " << first_sample_flags_present << endl;
		sample_duration_present_ = bb[8];
		//cout << "sample_duration_present " << sample_duration_present << endl;
		sample_size_present_ = bb[9];
		//cout << "sample_size_present " << sample_size_present << endl;
		sample_flags_present_ = bb[10];
		sample_composition_time_offsets_present_ = bb[11];

		//sentry.resize(sample_count);
		unsigned int offset = 16;
		if (data_offset_present_)
		{
			this->data_offset_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}if (first_sample_flags_present_) {
			this->first_sample_flags_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		// write all the entries to the trun box
		for (unsigned int i = 0; i < sample_count_; i++)
		{
			sample_entry ent = {};
			if (sample_duration_present_)
			{
				ent.sample_duration_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
			}
			if (sample_size_present_)
			{
				ent.sample_size_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
			}
			if (sample_flags_present_)
			{
				ent.sample_flags_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
			}
			if (sample_composition_time_offsets_present_)
			{
				if (version_ == 0)
					ent.sample_composition_time_offset_v0_ = fmp4_read_uint32(ptr + offset);
				else
					ent.sample_composition_time_offset_v1_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
			}
			m_sentry.push_back(ent);
		}
	}